

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O3

void QGuiApplicationPrivate::processKeyEvent(KeyEvent *e)

{
  quint16 count;
  int key;
  quint32 nativeScanCode;
  quint32 nativeVirtualKey;
  quint32 nativeModifiers;
  long lVar1;
  Data *pDVar2;
  bool bVar3;
  QInputDevice *device;
  QWindow *pQVar4;
  QFlagsStorage<Qt::KeyboardModifier> modifiers;
  QWindow *window;
  Type type;
  long in_FS_OFFSET;
  QString local_b8;
  QKeyEvent ev;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (e->super_InputEvent).super_UserEvent.window.wp.d;
  if ((pDVar2 == (Data *)0x0) || ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0))
  {
    window = (QWindow *)0x0;
  }
  else {
    window = (QWindow *)(e->super_InputEvent).super_UserEvent.window.wp.value;
  }
  modifiers.i = (e->super_InputEvent).modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                super_QFlagsStorage<Qt::KeyboardModifier>.i;
  if (((e->super_InputEvent).super_UserEvent.super_WindowSystemEvent.flags & 2) != 0) {
    window = focus_window;
  }
  modifier_buttons.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i =
       (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
       (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)modifiers.i;
  if (window == (QWindow *)0x0) {
    (e->super_InputEvent).super_UserEvent.super_WindowSystemEvent.eventAccepted = false;
  }
  else {
    type = e->keyType;
    if (type == KeyPress) {
      bVar3 = QWindowSystemInterface::handleShortcutEvent
                        (window,(e->super_InputEvent).super_UserEvent.timestamp,e->key,
                         (KeyboardModifiers)modifiers.i,e->nativeScanCode,e->nativeVirtualKey,
                         e->nativeModifiers,&e->unicode,e->repeat,e->repeatCount);
      if (bVar3) goto LAB_002d30cf;
      modifiers.i = (e->super_InputEvent).modifiers.
                    super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                    super_QFlagsStorage<Qt::KeyboardModifier>.i;
      type = e->keyType;
    }
    ev._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ev._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ev._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ev.m_text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    ev.m_text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    ev.super_QInputEvent._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ev.m_text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    ev.super_QInputEvent.m_dev = (QInputDevice *)&DAT_aaaaaaaaaaaaaaaa;
    ev.super_QInputEvent.m_timeStamp = (quint64)&DAT_aaaaaaaaaaaaaaaa;
    ev.super_QInputEvent._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ev.super_QInputEvent._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    key = e->key;
    nativeScanCode = e->nativeScanCode;
    nativeVirtualKey = e->nativeVirtualKey;
    nativeModifiers = e->nativeModifiers;
    bVar3 = e->repeat;
    count = e->repeatCount;
    local_b8.d.d = (Data *)0x0;
    local_b8.d.ptr = (char16_t *)0x0;
    local_b8.d.size = 0;
    device = QInputDevice::primaryKeyboard(&local_b8);
    QKeyEvent::QKeyEvent
              (&ev,type,key,(KeyboardModifiers)modifiers.i,nativeScanCode,nativeVirtualKey,
               nativeModifiers,&e->unicode,bVar3,count,device);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    ev.super_QInputEvent.m_timeStamp = (e->super_InputEvent).super_UserEvent.timestamp;
    if ((((popup_list.d.size == 0) || (popup_list.d.ptr[popup_list.d.size + -1] == (QWindow *)0x0))
        || (popup_list.d.ptr[popup_list.d.size + -1] == window)) ||
       (pQVar4 = QWindowPrivate::forwardToPopup
                           (*(QWindowPrivate **)&window->field_0x8,(QEvent *)&ev,
                            active_popup_on_press), pQVar4 == (QWindow *)0x0)) {
      if (*(char *)(*(long *)&window->field_0x8 + 0x13c) == '\0') {
        QCoreApplication::sendSpontaneousEvent(&window->super_QObject,(QEvent *)&ev);
      }
      (e->super_InputEvent).super_UserEvent.super_WindowSystemEvent.eventAccepted =
           (bool)ev.super_QInputEvent._12_1_;
    }
    QKeyEvent::~QKeyEvent(&ev);
  }
LAB_002d30cf:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGuiApplicationPrivate::processKeyEvent(QWindowSystemInterfacePrivate::KeyEvent *e)
{
    QWindow *window = e->window.data();
    modifier_buttons = e->modifiers;
    if (e->nullWindow()
#ifdef Q_OS_ANDROID
           || e->key == Qt::Key_Back || e->key == Qt::Key_Menu
#endif
            ) {
        window = QGuiApplication::focusWindow();
    }

    if (!window) {
        e->eventAccepted = false;
        return;
    }

#if defined(Q_OS_ANDROID)
    static bool backKeyPressAccepted = false;
    static bool menuKeyPressAccepted = false;
#endif

#if !defined(Q_OS_MACOS)
    // FIXME: Include OS X in this code path by passing the key event through
    // QPlatformInputContext::filterEvent().
    if (e->keyType == QEvent::KeyPress) {
        if (QWindowSystemInterface::handleShortcutEvent(window, e->timestamp, e->key, e->modifiers,
            e->nativeScanCode, e->nativeVirtualKey, e->nativeModifiers, e->unicode, e->repeat, e->repeatCount)) {
#if defined(Q_OS_ANDROID)
            backKeyPressAccepted = e->key == Qt::Key_Back;
            menuKeyPressAccepted = e->key == Qt::Key_Menu;
#endif
            return;
        }
    }
#endif

    QKeyEvent ev(e->keyType, e->key, e->modifiers,
                 e->nativeScanCode, e->nativeVirtualKey, e->nativeModifiers,
                 e->unicode, e->repeat, e->repeatCount);
    ev.setTimestamp(e->timestamp);

    const auto *activePopup = activePopupWindow();
    if (activePopup && activePopup != window) {
        // If the popup handles the event, we're done.
        if (window->d_func()->forwardToPopup(&ev, active_popup_on_press))
            return;
    }

    // only deliver key events when we have a window, and no modal window is blocking this window

    if (!window->d_func()->blockedByModalWindow)
        QGuiApplication::sendSpontaneousEvent(window, &ev);
#ifdef Q_OS_ANDROID
    else
        ev.setAccepted(false);

    if (e->keyType == QEvent::KeyPress) {
        backKeyPressAccepted = e->key == Qt::Key_Back && ev.isAccepted();
        menuKeyPressAccepted = e->key == Qt::Key_Menu && ev.isAccepted();
    } else if (e->keyType == QEvent::KeyRelease) {
        if (e->key == Qt::Key_Back && !backKeyPressAccepted && !ev.isAccepted()) {
            if (window)
                QWindowSystemInterface::handleCloseEvent(window);
        } else if (e->key == Qt::Key_Menu && !menuKeyPressAccepted && !ev.isAccepted()) {
            platform_theme->showPlatformMenuBar();
        }
    }
#endif
    e->eventAccepted = ev.isAccepted();
}